

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SocketsOps.cpp
# Opt level: O3

void sznet::net::sockets::sz_toipport(char *buf,size_t size,sockaddr *addr)

{
  size_t sVar1;
  ushort uVar2;
  char *__format;
  size_t __maxlen;
  
  if (addr->sa_family == 10) {
    *buf = '[';
    sz_toip(buf + 1,size - 1,addr);
    sVar1 = strlen(buf);
    __maxlen = size - sVar1;
    if (size < sVar1 || __maxlen == 0) {
      __assert_fail("size > end",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/sznet/net/SocketsOps.cpp"
                    ,0xf0,
                    "void sznet::net::sockets::sz_toipport(char *, size_t, const struct sockaddr *)"
                   );
    }
    uVar2 = swap_bytes(*(undefined2 *)addr->sa_data);
    __format = "]:%u";
  }
  else {
    sz_toip(buf,size,addr);
    sVar1 = strlen(buf);
    __maxlen = size - sVar1;
    if (size < sVar1 || __maxlen == 0) {
      __assert_fail("size > end",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/sznet/net/SocketsOps.cpp"
                    ,0xf8,
                    "void sznet::net::sockets::sz_toipport(char *, size_t, const struct sockaddr *)"
                   );
    }
    uVar2 = swap_bytes(*(undefined2 *)addr->sa_data);
    __format = ":%u";
  }
  snprintf(buf + sVar1,__maxlen,__format,(ulong)uVar2);
  return;
}

Assistant:

void sz_toipport(char* buf, size_t size, const struct sockaddr* addr)
{
	if (addr->sa_family == AF_INET6)
	{
		buf[0] = '[';
		sz_toip(buf + 1, size - 1, addr);
		size_t end = ::strlen(buf);
		const struct sockaddr_in6* addr6 = sz_sockaddrin6_cast(addr);
		uint16_t port = sockets::networkToHost16(addr6->sin6_port);
		assert(size > end);
		snprintf(buf + end, size - end, "]:%u", port);
		return;
	}
	sz_toip(buf, size, addr);
	size_t end = ::strlen(buf);
	const struct sockaddr_in* addr4 = sz_sockaddrin_cast(addr);
	uint16_t port = sockets::networkToHost16(addr4->sin_port);
	assert(size > end);
	snprintf(buf + end, size - end, ":%u", port);
}